

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

string * absl::debugging_internal::DemangleString_abi_cxx11_(char *mangled)

{
  char *__ptr;
  string *in_RDI;
  char *demangled;
  int status;
  string *out;
  int *in_stack_000010a0;
  size_t *in_stack_000010a8;
  char *in_stack_000010b0;
  char *in_stack_000010b8;
  
  std::__cxx11::string::string((string *)in_RDI);
  __ptr = __cxa_demangle(in_stack_000010b8,in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  if (__ptr == (char *)0x0) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  else {
    std::__cxx11::string::append((char *)in_RDI);
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string DemangleString(const char* mangled) {
  std::string out;
  int status = 0;
  char* demangled = nullptr;
#if ABSL_INTERNAL_HAS_CXA_DEMANGLE
  demangled = abi::__cxa_demangle(mangled, nullptr, nullptr, &status);
#endif
  if (status == 0 && demangled != nullptr) {
    out.append(demangled);
    free(demangled);
  } else {
    out.append(mangled);
  }
  return out;
}